

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O0

int Lms_ObjAreaUnmark_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  
  if (((*(ulong *)pObj >> 0x1e & 1) != 0) && (iVar1 = Gia_ObjIsCi(pObj), iVar1 == 0)) {
    *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff;
    pGVar3 = Gia_ObjFanin0(pObj);
    iVar1 = Lms_ObjAreaUnmark_rec(pGVar3);
    pGVar3 = Gia_ObjFanin1(pObj);
    iVar2 = Lms_ObjAreaUnmark_rec(pGVar3);
    return iVar1 + 1 + iVar2;
  }
  return 0;
}

Assistant:

int  Lms_ObjAreaUnmark_rec( Gia_Obj_t * pObj )
{
    if ( !pObj->fMark0 || Gia_ObjIsCi(pObj) )
        return 0;
    pObj->fMark0 = 0;
    return 1 + Lms_ObjAreaUnmark_rec( Gia_ObjFanin0(pObj) ) 
             + Lms_ObjAreaUnmark_rec( Gia_ObjFanin1(pObj) );
}